

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

char * __thiscall Fl_Text_Buffer::text_range(Fl_Text_Buffer *this,int start,int end)

{
  int iVar1;
  int iVar2;
  int part1Length;
  int copiedLength;
  int temp;
  char *s;
  int end_local;
  int start_local;
  Fl_Text_Buffer *this_local;
  
  if ((start < 0) || (this->mLength < start)) {
    this_local = (Fl_Text_Buffer *)malloc(1);
    *(undefined1 *)&this_local->input_file_was_transcoded = 0;
  }
  else {
    s._0_4_ = end;
    s._4_4_ = start;
    if (end < start) {
      s._0_4_ = start;
      s._4_4_ = end;
    }
    if (this->mLength < (int)s) {
      s._0_4_ = this->mLength;
    }
    iVar1 = (int)s - s._4_4_;
    this_local = (Fl_Text_Buffer *)malloc((long)(iVar1 + 1));
    if (this->mGapStart < (int)s) {
      if (s._4_4_ < this->mGapStart) {
        iVar2 = this->mGapStart - s._4_4_;
        memcpy(this_local,this->mBuf + s._4_4_,(long)iVar2);
        memcpy((void *)((long)&this_local->input_file_was_transcoded + (long)iVar2),
               this->mBuf + this->mGapEnd,(long)(iVar1 - iVar2));
      }
      else {
        memcpy(this_local,this->mBuf + (long)(this->mGapEnd - this->mGapStart) + (long)s._4_4_,
               (long)iVar1);
      }
    }
    else {
      memcpy(this_local,this->mBuf + s._4_4_,(long)iVar1);
    }
    *(undefined1 *)((long)&this_local->input_file_was_transcoded + (long)iVar1) = 0;
  }
  return (char *)this_local;
}

Assistant:

char *Fl_Text_Buffer::text_range(int start, int end) const {
  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))
  
  char *s = NULL;
  
  /* Make sure start and end are ok, and allocate memory for returned string.
   If start is bad, return "", if end is bad, adjust it. */
  if (start < 0 || start > mLength)
  {
    s = (char *) malloc(1);
    s[0] = '\0';
    return s;
  }
  if (end < start) {
    int temp = start;
    start = end;
    end = temp;
  }
  if (end > mLength)
    end = mLength;
  int copiedLength = end - start;
  s = (char *) malloc(copiedLength + 1);
  
  /* Copy the text from the buffer to the returned string */
  if (end <= mGapStart) {
    memcpy(s, mBuf + start, copiedLength);
  } else if (start >= mGapStart) {
    memcpy(s, mBuf + start + (mGapEnd - mGapStart), copiedLength);
  } else {
    int part1Length = mGapStart - start;
    memcpy(s, mBuf + start, part1Length);
    memcpy(s + part1Length, mBuf + mGapEnd, copiedLength - part1Length);
  }
  s[copiedLength] = '\0';
  return s;
}